

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDASVtolerances(void *ida_mem,sunrealtype reltol,N_Vector abstol)

{
  N_Vector p_Var1;
  undefined8 in_RSI;
  IDAMem in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  sunrealtype atolmin;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x2cf,"IDASVtolerances",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_MallocDone == 0) {
    IDAProcessError(in_RDI,-0x17,0x2d6,"IDASVtolerances",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"Attempt to call before IDAMalloc.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    dVar2 = (double)N_VMin(in_RSI);
    if (0.0 <= dVar2) {
      if (in_RDI->ida_VatolMallocDone == 0) {
        p_Var1 = (N_Vector)N_VClone(in_RDI->ida_ewt);
        in_RDI->ida_Vatol = p_Var1;
        in_RDI->ida_lrw = in_RDI->ida_lrw1 + in_RDI->ida_lrw;
        in_RDI->ida_liw = in_RDI->ida_liw1 + in_RDI->ida_liw;
        in_RDI->ida_VatolMallocDone = 1;
      }
      in_RDI->ida_rtol = in_XMM0_Qa;
      N_VScale(0x3ff0000000000000,in_RSI,in_RDI->ida_Vatol);
      in_RDI->ida_atolmin0 = (uint)(dVar2 == 0.0);
      in_RDI->ida_itol = 2;
      in_RDI->ida_user_efun = 0;
      in_RDI->ida_efun = IDAEwtSet;
      in_RDI->ida_edata = (void *)0x0;
      local_4 = 0;
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x2e7,"IDASVtolerances",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                      ,"Some atol component < 0.0 illegal.");
      local_4 = -0x16;
    }
  }
  else {
    IDAProcessError(in_RDI,-0x16,0x2df,"IDASVtolerances",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"rtol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDASVtolerances(void* ida_mem, sunrealtype reltol, N_Vector abstol)
{
  IDAMem IDA_mem;
  sunrealtype atolmin;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    return (IDA_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RTOL);
    return (IDA_ILL_INPUT);
  }

  atolmin = N_VMin(abstol);
  if (atolmin < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ATOL);
    return (IDA_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  if (!(IDA_mem->ida_VatolMallocDone))
  {
    IDA_mem->ida_Vatol = N_VClone(IDA_mem->ida_ewt);
    IDA_mem->ida_lrw += IDA_mem->ida_lrw1;
    IDA_mem->ida_liw += IDA_mem->ida_liw1;
    IDA_mem->ida_VatolMallocDone = SUNTRUE;
  }

  IDA_mem->ida_rtol = reltol;
  N_VScale(ONE, abstol, IDA_mem->ida_Vatol);
  IDA_mem->ida_atolmin0 = (atolmin == ZERO);

  IDA_mem->ida_itol = IDA_SV;

  IDA_mem->ida_user_efun = SUNFALSE;
  IDA_mem->ida_efun      = IDAEwtSet;
  IDA_mem->ida_edata     = NULL; /* will be set to ida_mem in InitialSetup */

  return (IDA_SUCCESS);
}